

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconsVisitor.cpp
# Opt level: O3

void __thiscall OpenMD::ZConsVisitor::~ZConsVisitor(ZConsVisitor *this)

{
  ZConsReader *this_00;
  pointer pZVar1;
  pointer piVar2;
  pointer pcVar3;
  pointer pdVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  
  (this->super_BaseVisitor)._vptr_BaseVisitor = (_func_int **)&PTR__ZConsVisitor_002bb648;
  this_00 = this->zconsReader_;
  if (this_00 != (ZConsReader *)0x0) {
    pZVar1 = (this_00->fixedZmolData_).
             super__Vector_base<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pZVar1 != (pointer)0x0) {
      operator_delete(pZVar1,(long)(this_00->fixedZmolData_).
                                   super__Vector_base<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pZVar1
                     );
    }
    piVar2 = (this_00->allZmols_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (piVar2 != (pointer)0x0) {
      operator_delete(piVar2,(long)(this_00->allZmols_).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)piVar2);
    }
    std::ifstream::~ifstream(this_00);
  }
  operator_delete(this_00,0x248);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&(this->zatomToZmol_)._M_t);
  pcVar3 = (this->zconsFilename_)._M_dataplus._M_p;
  paVar5 = &(this->zconsFilename_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar5) {
    operator_delete(pcVar3,paVar5->_M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>,_std::_Select1st<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::ZConsVisitor::ZConsState>_>_>
  ::~_Rb_tree(&(this->zmolStates_)._M_t);
  pdVar4 = (this->zconsPos).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar4 != (pointer)0x0) {
    operator_delete(pdVar4,(long)(this->zconsPos).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pdVar4);
  }
  (this->super_BaseVisitor)._vptr_BaseVisitor = (_func_int **)&PTR__BaseVisitor_002b6050;
  pcVar3 = (this->super_BaseVisitor).visitorName._M_dataplus._M_p;
  paVar5 = &(this->super_BaseVisitor).visitorName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar5) {
    operator_delete(pcVar3,paVar5->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

ZConsVisitor::~ZConsVisitor() { delete zconsReader_; }